

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_metadata.cpp
# Opt level: O0

shared_ptr<libtorrent::peer_plugin> __thiscall
libtorrent::anon_unknown_5::ut_metadata_plugin::new_connection
          (ut_metadata_plugin *this,peer_connection_handle *pc)

{
  connection_type cVar1;
  element_type *__args_2;
  peer_connection_handle *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<libtorrent::peer_plugin> sVar3;
  undefined1 local_48 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  bt_peer_connection *c;
  peer_connection_handle *pc_local;
  ut_metadata_plugin *this_local;
  
  pc_local = pc;
  this_local = this;
  cVar1 = peer_connection_handle::type(in_RDX);
  if (cVar1 == bittorrent) {
    peer_connection_handle::native_handle((peer_connection_handle *)(local_48 + 0x10));
    __args_2 = ::std::__shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>::
               get((__shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
                   (local_48 + 0x10));
    ::std::shared_ptr<libtorrent::aux::peer_connection>::~shared_ptr
              ((shared_ptr<libtorrent::aux::peer_connection> *)(local_48 + 0x10));
    local_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__args_2;
    ::std::
    make_shared<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin,libtorrent::aux::torrent&,libtorrent::aux::bt_peer_connection&,libtorrent::(anonymous_namespace)::ut_metadata_plugin&>
              ((torrent *)local_48,
               (bt_peer_connection *)
               (pc->m_connection).
               super___weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi,(ut_metadata_plugin *)__args_2);
    ::std::shared_ptr<libtorrent::peer_plugin>::
    shared_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin,void>
              ((shared_ptr<libtorrent::peer_plugin> *)this,
               (shared_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin> *)local_48);
    ::std::shared_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin>::~shared_ptr
              ((shared_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin> *)local_48);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    ::std::shared_ptr<libtorrent::peer_plugin>::shared_ptr
              ((shared_ptr<libtorrent::peer_plugin> *)this);
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<libtorrent::peer_plugin>)
         sVar3.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<peer_plugin> ut_metadata_plugin::new_connection(
		peer_connection_handle const& pc)
	{
		if (pc.type() != connection_type::bittorrent) return {};

		aux::bt_peer_connection* c = static_cast<aux::bt_peer_connection*>(pc.native_handle().get());
		return std::make_shared<ut_metadata_peer_plugin>(m_torrent, *c, *this);
	}